

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_AActor_A_QueueCorpse
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *ptr;
  int iVar1;
  DCorpsePointer *this;
  bool bVar2;
  bool local_47;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x136,
                  "int AF_AActor_A_QueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    ptr = (AActor *)(param->field_0).field_1.a;
    local_47 = true;
    if (ptr != (AActor *)0x0) {
      defaultparam = (TArray<VMValue,_VMValue> *)AActor::RegistrationInfo.MyClass;
      local_47 = DObject::IsKindOf((DObject *)ptr,AActor::RegistrationInfo.MyClass);
    }
    if (local_47 != false) {
      iVar1 = FIntCVar::operator_cast_to_int(&sv_corpsequeuesize);
      if (0 < iVar1) {
        this = (DCorpsePointer *)DObject::operator_new((DObject *)0x48,(size_t)defaultparam);
        DCorpsePointer::DCorpsePointer(this,ptr);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x136,
                  "int AF_AActor_A_QueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x136,
                "int AF_AActor_A_QueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_QueueCorpse)
{
	PARAM_SELF_PROLOGUE(AActor);

	if (sv_corpsequeuesize > 0)
	{
		new DCorpsePointer (self);
	}
	return 0;
}